

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O1

void __thiscall
Equality_importSourceNotEqualImportSourceReference_Test::TestBody
          (Equality_importSourceNotEqualImportSourceReference_Test *this)

{
  shared_ptr *psVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  ComponentPtr c2;
  ComponentPtr c1;
  ImportSourcePtr is2;
  ImportSourcePtr is1;
  AssertionResult local_90;
  long local_80 [2];
  long *local_70;
  AssertHelper local_68 [8];
  byte local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  long *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  shared_ptr *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"bob","");
  libcellml::Component::create((string *)&local_40);
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"bob","");
  libcellml::Component::create((string *)&local_50);
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  libcellml::ImportSource::create();
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"a_great_url","");
  libcellml::ImportSource::setUrl(local_20);
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  libcellml::ImportSource::create();
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"a_better_url","");
  libcellml::ImportSource::setUrl(local_30);
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  libcellml::ImportedEntity::setImportSource(local_40 + 0x10);
  psVar1 = local_40;
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"dave","");
  libcellml::ImportedEntity::setImportReference((string *)(psVar1 + 0x10));
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(local_50 + 2));
  local_90._0_8_ = local_50;
  local_90.message_.ptr_ = local_48;
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_48->_M_string_length = (int)local_48->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_48->_M_string_length = (int)local_48->_M_string_length + 1;
    }
  }
  local_60[0] = libcellml::Entity::equals(local_40);
  local_60[0] = local_60[0] ^ 1;
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_90.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90.message_.ptr_);
  }
  if (local_60[0] == 0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(char *)local_60,"c1->equals(c2)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x355,(char *)local_90._0_8_);
    testing::internal::AssertHelper::operator=(local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    if ((long *)local_90._0_8_ != local_80) {
      operator_delete((void *)local_90._0_8_,local_80[0] + 1);
    }
    if (local_70 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_70 != (long *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
      local_70 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return;
}

Assistant:

TEST(Equality, unitsNotEqualByUnitIdOnly)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second");
    u2->addUnit("second");

    u1->setUnitId(0, "UnitsASecond");

    EXPECT_NE(u1, u2);
    EXPECT_FALSE(u1->equals(u2));
    EXPECT_FALSE(u2->equals(u1));
    EXPECT_TRUE(libcellml::Units::equivalent(u1, u2));
}